

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_assembler.c
# Opt level: O0

int parse_args_DCL(Context_conflict *ctx)

{
  int iVar1;
  uint uVar2;
  uint32 local_1c;
  int samplerreg;
  uint32 index;
  uint32 usage;
  int issampler;
  Context_conflict *ctx_local;
  
  index = 0;
  samplerreg = 0;
  local_1c = 0;
  ctx->tokenbufpos = ctx->tokenbufpos + 1;
  ctx->tokenbuf[0] = 0;
  _usage = ctx;
  iVar1 = parse_dcl_usage(ctx,(uint32 *)&samplerreg,(int *)&index);
  if ((((iVar1 != 0) && (_usage->tokenlen != 0)) && (*_usage->token != '_')) &&
     (iVar1 = ui32fromtoken(_usage,&local_1c), iVar1 == 0)) {
    fail(_usage,"Expected usage index");
  }
  parse_destination_token(_usage);
  uVar2 = (uint)((_usage->dest_arg).regtype == REG_TYPE_SAMPLER);
  if (index == uVar2) {
    if (uVar2 == 0) {
      iVar1 = shader_is_pixel(_usage);
      if (iVar1 == 0) {
        _usage->tokenbuf[0] = samplerreg | local_1c << 0x10 | 0x80000000;
      }
      else {
        _usage->tokenbuf[0] = 0x80000000;
      }
    }
    else {
      _usage->tokenbuf[0] = samplerreg << 0x1b | 0x80000000;
    }
  }
  else {
    fail(_usage,"Invalid usage");
  }
  return 3;
}

Assistant:

static int parse_args_DCL(Context *ctx)
{
    int issampler = 0;
    uint32 usage = 0;
    uint32 index = 0;

    ctx->tokenbufpos++;  // save a spot for the usage/index token.
    ctx->tokenbuf[0] = 0;

    // parse_instruction_token() sets ctx->token to the end of the instruction
    //  so we can see if there are destination modifiers on the instruction
    //  itself...

    if (parse_dcl_usage(ctx, &usage, &issampler))
    {
        if ((ctx->tokenlen > 0) && (*ctx->token != '_'))
        {
            if (!ui32fromtoken(ctx, &index))
                fail(ctx, "Expected usage index");
        } // if
    } // if

    parse_destination_token(ctx);

    const int samplerreg = (ctx->dest_arg.regtype == REG_TYPE_SAMPLER);
    if (issampler != samplerreg)
        fail(ctx, "Invalid usage");
    else if (samplerreg)
        ctx->tokenbuf[0] = (usage << 27) | 0x80000000;
    else if (shader_is_pixel(ctx))  // all other pixel shader types are zero'd.
        ctx->tokenbuf[0] = 0x80000000;
    else
        ctx->tokenbuf[0] = usage | (index << 16) | 0x80000000;

    return 3;
}